

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<long>::Set(RepeatedField<long> *this,int index,long *value)

{
  long lVar1;
  long *plVar2;
  long *in_RDX;
  int in_ESI;
  RepeatedField<long> *in_stack_ffffffffffffff90;
  
  lVar1 = *in_RDX;
  plVar2 = elements(in_stack_ffffffffffffff90);
  plVar2[in_ESI] = lVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Set(int index, const Element& value) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  elements()[index] = value;
}